

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TransparentMemberSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::TransparentMemberSymbol,slang::ast::EnumValueSymbol&>
          (BumpAllocator *this,EnumValueSymbol *args)

{
  TransparentMemberSymbol *pTVar1;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pTVar1 = (TransparentMemberSymbol *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  ast::TransparentMemberSymbol::TransparentMemberSymbol
            ((TransparentMemberSymbol *)this,(Symbol *)args);
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }